

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O3

void lj_cdata_setfin(lua_State *L,GCcdata *cd,GCobj *obj,uint32_t it)

{
  uint64_t uVar1;
  GCtab *t;
  TValue *pTVar2;
  TValue tmp;
  cTValue local_20;
  
  uVar1 = (L->glref).ptr64;
  t = *(GCtab **)(*(long *)(uVar1 + 0x180) + 0x20);
  if ((t->metatable).gcptr64 != 0) {
    local_20.u64 = (ulong)cd | 0xfffa800000000000;
    if ((t->marked & 4) != 0) {
      t->marked = t->marked & 0xfb;
      (t->gclist).gcptr64 = *(uint64_t *)(uVar1 + 0x40);
      *(GCtab **)(uVar1 + 0x40) = t;
    }
    pTVar2 = lj_tab_set(L,t,&local_20);
    if (it == 0xffffffff) {
      pTVar2->u64 = 0xffffffffffffffff;
      cd->marked = cd->marked & 0xef;
    }
    else {
      pTVar2->u64 = (ulong)it << 0x2f | (ulong)obj;
      cd->marked = cd->marked | 0x10;
    }
  }
  return;
}

Assistant:

void lj_cdata_setfin(lua_State *L, GCcdata *cd, GCobj *obj, uint32_t it)
{
  GCtab *t = ctype_ctsG(G(L))->finalizer;
  if (gcref(t->metatable)) {
    /* Add cdata to finalizer table, if still enabled. */
    TValue *tv, tmp;
    setcdataV(L, &tmp, cd);
    lj_gc_anybarriert(L, t);
    tv = lj_tab_set(L, t, &tmp);
    if (it == LJ_TNIL) {
      setnilV(tv);
      cd->marked &= ~LJ_GC_CDATA_FIN;
    } else {
      setgcV(L, tv, obj, it);
      cd->marked |= LJ_GC_CDATA_FIN;
    }
  }
}